

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdef.c
# Opt level: O3

s3pid_t mdef_phone_id(mdef_t *m,s3cipid_t ci,s3cipid_t lc,s3cipid_t rc,word_posn_t wpos)

{
  ushort uVar1;
  int iVar2;
  ph_lc_t *lcptr;
  ph_lc_t *ppVar3;
  ushort uVar4;
  short sVar5;
  uint uVar6;
  undefined6 in_register_00000032;
  
  uVar6 = (uint)(ushort)lc;
  if (m == (mdef_t *)0x0) {
    __assert_fail("m",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
                  ,0x12a,
                  "s3pid_t mdef_phone_id(mdef_t *, s3cipid_t, s3cipid_t, s3cipid_t, word_posn_t)");
  }
  if (-1 < ci) {
    iVar2 = m->n_ciphone;
    if ((int)CONCAT62(in_register_00000032,ci) < iVar2) {
LAB_00114b75:
      uVar4 = rc;
      sVar5 = (short)uVar6;
      if ((sVar5 < 0) || (uVar6 = (uint)sVar5, iVar2 <= (int)uVar6)) {
        __assert_fail("(lc >= 0) && (lc < m->n_ciphone)",
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
                      ,300,
                      "s3pid_t mdef_phone_id(mdef_t *, s3cipid_t, s3cipid_t, s3cipid_t, word_posn_t)"
                     );
      }
      if (((short)uVar4 < 0) || (iVar2 <= (short)uVar4)) {
        __assert_fail("(rc >= 0) && (rc < m->n_ciphone)",
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
                      ,0x12d,
                      "s3pid_t mdef_phone_id(mdef_t *, s3cipid_t, s3cipid_t, s3cipid_t, word_posn_t)"
                     );
      }
      if (WORD_POSN_SINGLE < wpos) {
        __assert_fail("(wpos >= 0) && (wpos < N_WORD_POSN)",
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
                      ,0x12e,
                      "s3pid_t mdef_phone_id(mdef_t *, s3cipid_t, s3cipid_t, s3cipid_t, word_posn_t)"
                     );
      }
      for (ppVar3 = m->wpos_ci_lclist[wpos][CONCAT62(in_register_00000032,ci) & 0xffffffff];
          ppVar3 != (ph_lc_t *)0x0; ppVar3 = ppVar3->next) {
        if (ppVar3->lc == sVar5) goto LAB_00114bcf;
      }
      goto LAB_00114bd8;
    }
  }
  __assert_fail("(ci >= 0) && (ci < m->n_ciphone)",
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
                ,299,"s3pid_t mdef_phone_id(mdef_t *, s3cipid_t, s3cipid_t, s3cipid_t, word_posn_t)"
               );
LAB_00114bcf:
  while (ppVar3 = (ph_lc_t *)ppVar3->rclist, ppVar3 != (ph_lc_t *)0x0) {
    if (ppVar3->lc == uVar4) {
      return *(s3pid_t *)&ppVar3->field_0x4;
    }
  }
LAB_00114bd8:
  uVar1 = m->sil;
  if ((short)uVar1 < 0) {
    return -1;
  }
  if (m->ciphone[uVar6].filler != 0) {
    uVar6 = (uint)uVar1;
  }
  rc = uVar4;
  if (m->ciphone[(uint)(int)(short)uVar4].filler != 0) {
    rc = uVar1;
  }
  if (((short)uVar6 == sVar5) && (rc == uVar4)) {
    return -1;
  }
  goto LAB_00114b75;
}

Assistant:

s3pid_t
mdef_phone_id(mdef_t * m,
              s3cipid_t ci, s3cipid_t lc, s3cipid_t rc, word_posn_t wpos)
{
    ph_lc_t *lcptr;
    ph_rc_t *rcptr;
    s3cipid_t newl, newr;

    assert(m);
    assert((ci >= 0) && (ci < m->n_ciphone));
    assert((lc >= 0) && (lc < m->n_ciphone));
    assert((rc >= 0) && (rc < m->n_ciphone));
    assert((wpos >= 0) && (wpos < N_WORD_POSN));

    if (((lcptr =
          find_ph_lc(m->wpos_ci_lclist[wpos][(int) ci], lc)) == NULL)
        || ((rcptr = find_ph_rc(lcptr->rclist, rc)) == NULL)) {
        /* Not found; backoff to silence context if non-silence filler context */
        if (NOT_S3CIPID(m->sil))
            return BAD_S3PID;

        newl = m->ciphone[(int) lc].filler ? m->sil : lc;
        newr = m->ciphone[(int) rc].filler ? m->sil : rc;
        if ((newl == lc) && (newr == rc))
            return BAD_S3PID;

        return (mdef_phone_id(m, ci, newl, newr, wpos));
    }

    return (rcptr->pid);
}